

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void init_nhcolors(void)

{
  char *__s;
  byte bVar1;
  byte bVar2;
  char cVar3;
  nh_bool nVar4;
  int iVar5;
  size_t sVar6;
  FILE *__stream;
  char *pcVar7;
  long lVar8;
  FILE *map;
  char **ppcVar9;
  int colorValue;
  int pos;
  char line [256];
  fnchar filename [256];
  int local_244;
  int local_240;
  int local_23c;
  char local_238 [256];
  FILE local_138;
  
  cVar3 = has_colors();
  if (cVar3 != '\0') {
    ui_flags.color = '\x01';
    start_color();
    use_default_colors();
    color_map.fgColors[0] = 0;
    color_map.fgColors[1] = 1;
    color_map.fgColors[2] = 2;
    color_map.fgColors[3] = 3;
    color_map.fgColors[4] = 4;
    color_map.fgColors[5] = 5;
    color_map.fgColors[6] = 6;
    color_map.fgColors[7] = -1;
    color_map.fgColors[8] = 7;
    color_map.fgColors[9] = 9;
    color_map.fgColors[10] = 10;
    color_map.fgColors[0xb] = 0xb;
    color_map.fgColors[0xc] = 0xc;
    color_map.fgColors[0xd] = 0xd;
    color_map.fgColors[0xe] = 0xe;
    color_map.fgColors[0xf] = 0xf;
    color_map.bgColors[0] = 0;
    color_map.bgColors[1] = 1;
    color_map.bgColors[2] = 2;
    color_map.bgColors[3] = 3;
    color_map.bgColors[4] = 4;
    color_map.bgColors[5] = 5;
    color_map.bgColors[6] = 6;
    color_map.bgColors[7] = -1;
    color_map.bgColors[8] = 7;
    color_map.bgColors[9] = 9;
    color_map.bgColors[10] = 10;
    color_map.bgColors[0xb] = 0xb;
    color_map.bgColors[0xc] = 0xc;
    color_map.bgColors[0xd] = 0xd;
    color_map.bgColors[0xe] = 0xe;
    color_map.bgColors[0xf] = 0xf;
    local_138._flags._0_1_ = 0;
    map = (FILE *)0x0;
    nVar4 = get_gamedir(CONFIG_DIR,(char *)&local_138);
    if (nVar4 != '\0') {
      map = &local_138;
      sVar6 = strlen((char *)map);
      *(undefined8 *)((long)&local_138._flags + sVar6) = 0x70616d726f6c6f63;
      *(undefined8 *)(local_138._shortbuf + (sVar6 - 0x7d)) = 0x666e6f632e7061;
      __stream = fopen((char *)map,"r");
      if (__stream != (FILE *)0x0) {
        pcVar7 = fgets(local_238,0x100,__stream);
        if (pcVar7 != (char *)0x0) {
          do {
            iVar5 = __isoc99_sscanf(local_238," %n%*s %i",&local_240,&local_244);
            if ((iVar5 == 1) && (lVar8 = (long)local_240, local_238[lVar8] != '#')) {
              pcVar7 = local_238 + lVar8;
              local_23c = strncmp(pcVar7,"fg.",3);
              if (local_23c == 0) {
                pcVar7 = local_238 + lVar8 + 3;
                bVar2 = 0;
LAB_00108e2b:
                bVar1 = 0;
              }
              else {
                iVar5 = strncmp(pcVar7,"bg.",3);
                if (iVar5 != 0) {
                  bVar2 = 1;
                  goto LAB_00108e2b;
                }
                pcVar7 = local_238 + lVar8 + 3;
                bVar1 = 1;
                bVar2 = 0;
              }
              ppcVar9 = colorNames;
              lVar8 = 0;
              do {
                __s = *ppcVar9;
                sVar6 = strlen(__s);
                iVar5 = strncmp(pcVar7,__s,sVar6);
                if (iVar5 == 0) goto LAB_00108e80;
                lVar8 = lVar8 + 1;
                ppcVar9 = ppcVar9 + 1;
              } while (lVar8 != 0x10);
              lVar8 = 0xffffffff;
LAB_00108e80:
              iVar5 = (int)lVar8;
              if (((iVar5 != -1) && (-1 < local_244)) && (local_244 < _COLORS)) {
                if (!(bool)(local_23c != 0 & (bVar2 ^ 1))) {
                  color_map.fgColors[iVar5] = (short)local_244;
                }
                if ((bool)(bVar2 | bVar1)) {
                  color_map.bgColors[iVar5] = (short)local_244;
                }
              }
            }
            pcVar7 = fgets(local_238,0x100,__stream);
          } while (pcVar7 != (char *)0x0);
        }
        fclose(__stream);
        map = __stream;
      }
    }
    apply_colormap((ColorMap *)map);
  }
  return;
}

Assistant:

void init_nhcolors(void)
{
    if (!has_colors())
	return;

    ui_flags.color = TRUE;

    start_color();
    use_default_colors();

    read_colormap(&color_map);
    apply_colormap(&color_map);
}